

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput_x86_fma::forward
          (Yolov3DetectionOutput_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint *puVar1;
  size_t sVar2;
  void *pvVar3;
  ulong uVar4;
  Mat *this_00;
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  int iVar7;
  uint *puVar8;
  ulong uVar9;
  ulong uVar10;
  _func_int *p_Var11;
  pointer pBVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  float *pfVar21;
  pointer pMVar22;
  float *pfVar23;
  int i;
  int iVar24;
  long lVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 extraout_var [60];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_ZMM4 [64];
  float *local_190;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  float *local_170;
  undefined8 local_168;
  int local_140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar19 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar19) {
      Yolov3DetectionOutput::qsort_descent_inplace
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_fma +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_fma[-3]),&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = 0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      Yolov3DetectionOutput::nms_sorted_bboxes
                ((Yolov3DetectionOutput *)
                 ((long)&this->_vptr_Yolov3DetectionOutput_x86_fma +
                 (long)this->_vptr_Yolov3DetectionOutput_x86_fma[-3]),&all_bbox_rects,&picked,
                 *(float *)(&this->field_0xdc + (long)this->_vptr_Yolov3DetectionOutput_x86_fma[-3])
                );
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (uVar19 = 0;
          uVar19 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           CONCAT44(picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    picked.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_) >> 3);
          uVar19 = uVar19 + 1) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    *(long *)(CONCAT44(picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                       picked.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 8
                             ));
      }
      uVar19 = ((long)bbox_rects.
                      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)bbox_rects.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x1c;
      iVar24 = (int)uVar19;
      if (iVar24 == 0) {
        iVar7 = 0;
      }
      else {
        this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(this_00,6,iVar24,4,opt->blob_allocator);
        pvVar3 = this_00->data;
        iVar7 = -100;
        if ((pvVar3 != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
          iVar7 = 0;
          uVar19 = uVar19 & 0xffffffff;
          if (iVar24 < 1) {
            uVar19 = 0;
          }
          pBVar12 = bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (uVar15 = 0; uVar19 != uVar15; uVar15 = uVar15 + 1) {
            fVar26 = pBVar12->score;
            lVar18 = (long)this_00->w * uVar15 * this_00->elemsize;
            *(float *)((long)pvVar3 + lVar18) = (float)(pBVar12->label + 1);
            *(float *)((long)pvVar3 + lVar18 + 4) = fVar26;
            *(float *)((long)pvVar3 + lVar18 + 8) = pBVar12->xmin;
            *(float *)((long)pvVar3 + lVar18 + 0xc) = pBVar12->ymin;
            *(float *)((long)pvVar3 + lVar18 + 0x10) = pBVar12->xmax;
            *(float *)((long)pvVar3 + lVar18 + 0x14) = pBVar12->ymax;
            pBVar12 = pBVar12 + 1;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_00431494:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar7;
    }
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bbox_rects.
    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)&bbox_rects,
             (long)*(int *)(&this->field_0xd4 + (long)this->_vptr_Yolov3DetectionOutput_x86_fma[-3])
            );
    pMVar22 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    p_Var11 = this->_vptr_Yolov3DetectionOutput_x86_fma[-3];
    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var11);
    iVar7 = pMVar22[uVar19].c / iVar24;
    if (iVar7 != *(int *)(&this->field_0xd0 + (long)p_Var11) + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)&bbox_rects);
      iVar7 = -1;
      goto LAB_00431494;
    }
    pMVar22 = pMVar22 + uVar19;
    lVar18 = (long)iVar24;
    uVar15._0_4_ = pMVar22->w;
    uVar15._4_4_ = pMVar22->h;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar15;
    auVar29 = vcvtdq2ps_avx(auVar29);
    fVar26 = *(float *)(*(long *)(&this->field_0x170 + (long)p_Var11) + uVar19 * 4);
    auVar35._0_4_ = fVar26 * auVar29._0_4_;
    auVar35._4_4_ = fVar26 * auVar29._4_4_;
    auVar35._8_4_ = fVar26 * auVar29._8_4_;
    auVar35._12_4_ = fVar26 * auVar29._12_4_;
    auVar35 = vroundps_avx(auVar35,0xb);
    uVar13 = 0;
    if (0 < (int)(undefined4)uVar15) {
      uVar13 = uVar15 & 0xffffffff;
    }
    uVar20 = uVar15 >> 0x20;
    if (uVar15._4_4_ == 0 || (long)uVar15 < 0) {
      uVar20 = 0;
    }
    auVar36._0_12_ = ZEXT412(0x3f000000) << 0x40;
    auVar36._12_4_ = 0x3f000000;
    auVar43._8_8_ = auVar36._8_8_;
    auVar43._0_8_ = auVar29._0_8_;
    auVar36 = vrcpps_avx(auVar43);
    auVar37._8_4_ = 0x3f800000;
    auVar37._0_8_ = 0x3f8000003f800000;
    auVar37._12_4_ = 0x3f800000;
    auVar37 = vfmsub213ps_fma(auVar36,auVar43,auVar37);
    auVar36 = vfnmadd132ps_fma(auVar37,auVar36,auVar36);
    for (lVar14 = 0; lVar14 < iVar24; lVar14 = lVar14 + 1) {
      lVar16 = lVar14 * iVar7;
      sVar2 = pMVar22->cstep;
      pvVar3 = pMVar22->data;
      uVar4 = pMVar22->elemsize;
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar37 = vmovhps_avx(auVar30,*(undefined8 *)
                                     (*(long *)(&this->field_0xe0 + (long)p_Var11) +
                                     (long)((int)*(float *)(*(long *)(&this->field_0x128 +
                                                                     (long)p_Var11) +
                                                            lVar18 * uVar19 * 4 + lVar14 * 4) * 2) *
                                     4));
      local_190 = (float *)(sVar2 * lVar16 * uVar4 + (long)pvVar3);
      pfVar23 = (float *)((lVar16 + 1) * sVar2 * uVar4 + (long)pvVar3);
      pfVar17 = (float *)((lVar16 + 2) * sVar2 * uVar4 + (long)pvVar3);
      local_170 = (float *)((lVar16 + 3) * sVar2 * uVar4 + (long)pvVar3);
      pfVar21 = (float *)((lVar16 + 4) * sVar2 * uVar4 + (long)pvVar3);
      lVar25 = (long)(int)(((long)pMVar22->d * uVar4 * (long)pMVar22->h * (long)pMVar22->w + 0xf &
                           0xfffffffffffffff0) / uVar4);
      for (uVar10 = 0; uVar10 != uVar20; uVar10 = uVar10 + 1) {
        auVar31._0_4_ = (float)(int)uVar10;
        auVar31._4_12_ = in_ZMM4._4_12_;
        auVar43 = vshufps_avx(auVar31,auVar35,0x40);
        for (uVar9 = 0; uVar9 != uVar13; uVar9 = uVar9 + 1) {
          puVar8 = (uint *)((long)pvVar3 +
                           uVar9 * 4 +
                           uVar10 * (long)(int)(undefined4)uVar15 * 4 + (lVar16 + 5) * sVar2 * uVar4
                           );
          p_Var11 = this->_vptr_Yolov3DetectionOutput_x86_fma[-3];
          puVar1 = puVar8 + *(int *)(&this->field_0xd0 + (long)p_Var11) * lVar25;
          auVar42 = ZEXT464(0xff7fffff);
          while( true ) {
            if (puVar1 <= puVar8) break;
            auVar30 = vmaxss_avx(ZEXT416(*puVar8),auVar42._0_16_);
            auVar42 = ZEXT1664(auVar30);
            puVar8 = puVar8 + lVar25;
          }
          fVar26 = expf(-*pfVar21);
          fVar27 = expf(-auVar42._0_4_);
          auVar30 = vfmadd132ss_fma(ZEXT416((uint)(fVar27 + 1.0)),SUB6416(ZEXT464(0x3f800000),0),
                                    ZEXT416((uint)fVar26));
          fVar26 = 1.0 / auVar30._0_4_;
          if (*(float *)(&this->field_0xd8 + (long)p_Var11) <= fVar26) {
            fVar27 = expf(-*local_190);
            fVar28 = expf(-*pfVar23);
            auVar30 = vinsertps_avx(ZEXT416((uint)(fVar27 + 1.0)),ZEXT416((uint)(fVar28 + 1.0)),0x10
                                   );
            fVar27 = expf(*pfVar17);
            local_168 = CONCAT44(extraout_XMM0_Db,fVar27);
            auVar42._0_4_ = expf(*local_170);
            auVar42._4_60_ = extraout_var;
            auVar31 = vrcpps_avx(auVar30);
            auVar44._0_4_ = auVar37._0_4_ * auVar31._0_4_;
            auVar44._4_4_ = auVar37._4_4_ * auVar31._4_4_;
            auVar44._8_4_ = auVar37._8_4_ * auVar31._8_4_;
            auVar44._12_4_ = auVar37._12_4_ * auVar31._12_4_;
            auVar30 = vfmsub213ps_fma(auVar30,auVar44,auVar37);
            auVar34 = vfnmadd213ps_fma(auVar30,auVar31,auVar44);
            in_ZMM4 = ZEXT1664(auVar34);
            auVar38._8_8_ = local_168;
            auVar38._0_8_ = local_168;
            auVar30 = vinsertps_avx(auVar38,auVar42._0_16_,0x30);
            auVar5._4_8_ = auVar30._8_8_;
            auVar5._0_4_ = auVar37._4_4_ * auVar30._4_4_;
            auVar32._0_8_ = auVar5._0_8_ << 0x20;
            auVar32._8_4_ = auVar37._8_4_ * auVar30._8_4_;
            auVar32._12_4_ = auVar37._12_4_ * auVar30._12_4_;
            auVar33._8_8_ = auVar32._8_8_;
            auVar33._0_8_ = auVar34._0_8_;
            local_140 = (int)uVar9;
            auVar39._0_4_ = (float)local_140;
            auVar39._4_12_ = auVar43._4_12_;
            auVar30 = vrcpps_avx(auVar39);
            auVar47._0_4_ = auVar34._0_4_ * auVar30._0_4_;
            auVar47._4_4_ = auVar34._4_4_ * auVar30._4_4_;
            auVar47._8_4_ = auVar32._8_4_ * auVar30._8_4_;
            auVar47._12_4_ = auVar32._12_4_ * auVar30._12_4_;
            auVar31 = vfmsub231ps_fma(auVar33,auVar39,auVar47);
            auVar32 = vfnmadd213ps_fma(auVar31,auVar30,auVar47);
            local_88 = auVar36._0_4_;
            fStack_84 = auVar36._4_4_;
            fStack_80 = auVar36._8_4_;
            fStack_7c = auVar36._12_4_;
            auVar40._0_4_ = (auVar34._0_4_ + auVar39._0_4_) * local_88;
            auVar40._4_4_ = (auVar34._4_4_ + auVar43._4_4_) * fStack_84;
            auVar40._8_4_ = (auVar34._8_4_ + auVar43._8_4_) * fStack_80;
            auVar40._12_4_ = (auVar34._12_4_ + auVar43._12_4_) * fStack_7c;
            auVar45._0_4_ = auVar32._0_4_ * auVar29._0_4_;
            auVar45._4_4_ = auVar32._4_4_ * auVar29._4_4_;
            auVar45._8_4_ = auVar32._8_4_ * 0.5;
            auVar45._12_4_ = auVar32._12_4_ * 0.5;
            auVar30 = vshufpd_avx(auVar45,auVar40,1);
            auVar31 = vsubps_avx(auVar40,auVar30);
            auVar6._4_8_ = auVar45._8_8_;
            auVar6._0_4_ = auVar45._4_4_ + auVar30._4_4_;
            auVar46._0_8_ = auVar6._0_8_ << 0x20;
            auVar46._8_4_ = auVar45._8_4_ + auVar30._8_4_;
            auVar46._12_4_ = auVar45._12_4_ + auVar30._12_4_;
            auVar41._0_8_ = auVar31._0_8_;
            auVar41._8_8_ = auVar46._8_8_;
            auVar30 = vmovshdup_avx(auVar32);
            auVar34._0_4_ = auVar30._0_4_ * auVar32._0_4_;
            auVar34._4_4_ = auVar30._4_4_ * auVar32._4_4_;
            auVar34._8_4_ = auVar30._8_4_ * auVar32._8_4_;
            auVar34._12_4_ = auVar30._12_4_ * auVar32._12_4_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._4_4_ = auVar31._0_4_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = auVar41._4_8_;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = vextractps_avx(auVar34,2);
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = fVar26;
            picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = auVar46._12_4_;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)(&(bbox_rects.
                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                              ._M_impl.super__Vector_impl_data._M_start)->score + lVar14 * 6),
                        (value_type *)&picked);
          }
          local_190 = local_190 + 1;
          pfVar23 = pfVar23 + 1;
          pfVar17 = pfVar17 + 1;
          local_170 = local_170 + 1;
          pfVar21 = pfVar21 + 1;
        }
      }
      p_Var11 = this->_vptr_Yolov3DetectionOutput_x86_fma[-3];
      iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var11);
    }
    lVar18 = 8;
    for (lVar14 = 0; lVar14 < *(int *)(&this->field_0xd4 + (long)p_Var11); lVar14 = lVar14 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar18 + -8),
                 *(BBoxRect **)
                  ((long)&(bbox_rects.
                           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           ._M_impl.super__Vector_impl_data._M_start)->score + lVar18));
      p_Var11 = this->_vptr_Yolov3DetectionOutput_x86_fma[-3];
      lVar18 = lVar18 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)&bbox_rects);
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
//printf("%d %d\n", net_w, net_h);

//printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            const int cs = scores.cstep;

#if __AVX2__
            const __m256i vi = _mm256_setr_epi32(
                                   0, cs * 1, cs * 2, cs * 3, cs * 4, cs * 5, cs * 6, cs * 7);
#endif

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
#if 0
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }
#else
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    float* ptr = ((float*)scores.data) + i * w + j;
                    float* end = ptr + num_class * cs;
                    int q = 0;
#if __AVX2__
                    float* end8 = ptr + (num_class & -8) * cs;
                    unsigned long index;

                    for (; ptr < end8; ptr += 8 * cs, q += 8)
                    {
                        __m256 p = _mm256_i32gather_ps(ptr, vi, 4);
                        __m256 t = _mm256_max_ps(p, _mm256_permute2f128_ps(p, p, 1));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0x4e));
                        t = _mm256_max_ps(t, _mm256_permute_ps(t, 0xb1));
                        float score = _mm_cvtss_f32(_mm256_extractf128_ps(t, 0));

                        if (score > class_score)
                        {
                            __m256 mi = _mm256_cmp_ps(p, t, _CMP_EQ_OQ);
                            int mask = _mm256_movemask_ps(mi);
#ifdef _MSC_VER
                            BitScanForward(&index, mask);
#else
                            index = __builtin_ctz(mask);
#endif
                            class_index = q + index;
                            class_score = score;
                        }
                    }
#endif

                    for (; ptr < end; ptr += cs, q++)
                    {
                        if (*ptr > class_score)
                        {
                            class_index = q;
                            class_score = *ptr;
                        }
                    }
#endif
                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}